

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lrzip.c
# Opt level: O1

int archive_write_lrzip_open(archive_write_filter *f)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  archive_string local_38;
  
  puVar1 = (undefined8 *)f->data;
  local_38.s = (char *)0x0;
  local_38.length = 0;
  local_38.buffer_length = 0;
  archive_strncat(&local_38,"lrzip -q",8);
  uVar2 = *(int *)((long)puVar1 + 0xc) - 1;
  if (uVar2 < 5) {
    archive_strcat(&local_38,&DAT_00171a4c + *(int *)(&DAT_00171a4c + (ulong)uVar2 * 4));
  }
  if (0 < *(int *)(puVar1 + 1)) {
    archive_strcat(&local_38," -L ");
    archive_strappend_char(&local_38,*(char *)(puVar1 + 1) + '0');
  }
  iVar3 = __archive_write_program_open(f,(archive_write_program_data *)*puVar1,local_38.s);
  archive_string_free(&local_38);
  return iVar3;
}

Assistant:

static int
archive_write_lrzip_open(struct archive_write_filter *f)
{
	struct write_lrzip *data = (struct write_lrzip *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lrzip -q");

	/* Specify compression type. */
	switch (data->compression) {
	case lzma:/* default compression */
		break;
	case bzip2:
		archive_strcat(&as, " -b");
		break;
	case gzip:
		archive_strcat(&as, " -g");
		break;
	case lzo:
		archive_strcat(&as, " -l");
		break;
	case none:
		archive_strcat(&as, " -n");
		break;
	case zpaq:
		archive_strcat(&as, " -z");
		break;
	}

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -L ");
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}